

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddTable.c
# Opt level: O0

DdNode * cuddAllocNode(DdManager *unique)

{
  _func_void_long *p_Var1;
  int iVar2;
  DdNode *pDVar3;
  ptruint offset;
  DD_OOMFP saveHandler;
  DdNode *node;
  DdNode *list;
  DdNodePtr *mem;
  int i;
  DdManager *unique_local;
  
  if (unique->nextFree == (DdNode *)0x0) {
    if (unique->maxLive < (unique->keys - unique->dead) + (unique->keysZ - unique->deadZ)) {
      unique->errorCode = CUDD_TOO_MANY_NODES;
      return (DdNode *)0x0;
    }
    if ((unique->stash == (char *)0x0) || (unique->maxmemhard < unique->memused)) {
      cuddGarbageCollect(unique,1);
    }
    p_Var1 = Extra_UtilMMoutOfMemory;
    if (unique->nextFree == (DdNode *)0x0) {
      if (unique->maxmemhard < unique->memused) {
        unique->errorCode = CUDD_MAX_MEM_EXCEEDED;
        return (DdNode *)0x0;
      }
      Extra_UtilMMoutOfMemory = Cudd_OutOfMem;
      list = (DdNode *)malloc(0xa000);
      Extra_UtilMMoutOfMemory = p_Var1;
      if ((list == (DdNode *)0x0) && (iVar2 = cuddGarbageCollect(unique,1), iVar2 == 0)) {
        if (unique->stash != (char *)0x0) {
          if (unique->stash != (char *)0x0) {
            free(unique->stash);
            unique->stash = (char *)0x0;
          }
          unique->stash = (char *)0x0;
          cuddSlowTableGrowth(unique);
          list = (DdNode *)malloc(0xa000);
        }
        if (list == (DdNode *)0x0) {
          (*Extra_UtilMMoutOfMemory)(0x9fd8);
          unique->errorCode = CUDD_MEMORY_OUT;
          return (DdNode *)0x0;
        }
      }
      if (list != (DdNode *)0x0) {
        unique->memused = unique->memused + 0x9fd8;
        *(DdNode ***)list = unique->memoryList;
        unique->memoryList = (DdNode **)list;
        pDVar3 = (DdNode *)((long)&list->index + (0x20 - ((ulong)list & 0x1f) & 0xfffffffffffffff8))
        ;
        if (((ulong)pDVar3 & 0x1f) != 0) {
          __assert_fail("((ptruint) mem & (32 - 1)) == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/cudd/cuddTable.c"
                        ,0x139,"DdNode *cuddAllocNode(DdManager *)");
        }
        mem._4_4_ = 1;
        do {
          pDVar3[mem._4_4_ + -1].ref = 0;
          pDVar3[mem._4_4_ + -1].next = pDVar3 + mem._4_4_;
          mem._4_4_ = mem._4_4_ + 1;
        } while (mem._4_4_ < 0x3fe);
        pDVar3[0x3fd].ref = 0;
        pDVar3[0x3fd].next = (DdNode *)0x0;
        unique->nextFree = pDVar3;
      }
    }
  }
  unique->allocated = unique->allocated + 1;
  pDVar3 = unique->nextFree;
  unique->nextFree = pDVar3->next;
  pDVar3->Id = unique->allocated << 4;
  return pDVar3;
}

Assistant:

DdNode *
cuddAllocNode(
  DdManager * unique)
{
    int i;
    DdNodePtr *mem;
    DdNode *list, *node;
    extern DD_OOMFP MMoutOfMemory;
    DD_OOMFP saveHandler;

    if (unique->nextFree == NULL) {     /* free list is empty */
        /* Check for exceeded limits. */
        if ((unique->keys - unique->dead) + (unique->keysZ - unique->deadZ) >
            unique->maxLive) {
            unique->errorCode = CUDD_TOO_MANY_NODES;
            return(NULL);
        }
        if (unique->stash == NULL || unique->memused > unique->maxmemhard) {
            (void) cuddGarbageCollect(unique,1);
            mem = NULL;
        }
        if (unique->nextFree == NULL) {
            if (unique->memused > unique->maxmemhard) {
                unique->errorCode = CUDD_MAX_MEM_EXCEEDED;
                return(NULL);
            }
            /* Try to allocate a new block. */
            saveHandler = MMoutOfMemory;
            MMoutOfMemory = Cudd_OutOfMem;
//            mem = (DdNodePtr *) ABC_ALLOC(DdNode,DD_MEM_CHUNK + 1);
            mem = (DdNodePtr *) ABC_ALLOC(DdNode,DD_MEM_CHUNK + 2);
            MMoutOfMemory = saveHandler;
            if (mem == NULL) {
                /* No more memory: Try collecting garbage. If this succeeds,
                ** we end up with mem still NULL, but unique->nextFree !=
                ** NULL. */
                if (cuddGarbageCollect(unique,1) == 0) {
                    /* Last resort: Free the memory stashed away, if there
                    ** any. If this succeeeds, mem != NULL and
                    ** unique->nextFree still NULL. */
                    if (unique->stash != NULL) {
                        ABC_FREE(unique->stash);
                        unique->stash = NULL;
                        /* Inhibit resizing of tables. */
                        cuddSlowTableGrowth(unique);
                        /* Now try again. */
//                        mem = (DdNodePtr *) ABC_ALLOC(DdNode,DD_MEM_CHUNK + 1);
                        mem = (DdNodePtr *) ABC_ALLOC(DdNode,DD_MEM_CHUNK + 2);
                    }
                    if (mem == NULL) {
                        /* Out of luck. Call the default handler to do
                        ** whatever it specifies for a failed malloc.
                        ** If this handler returns, then set error code,
                        ** print warning, and return. */
                        (*MMoutOfMemory)(sizeof(DdNode)*(DD_MEM_CHUNK + 1));
                        unique->errorCode = CUDD_MEMORY_OUT;
#ifdef DD_VERBOSE
                        (void) fprintf(unique->err,
                                       "cuddAllocNode: out of memory");
                        (void) fprintf(unique->err, "Memory in use = %lu\n",
                                       unique->memused);
#endif
                        return(NULL);
                    }
                }
            }
            if (mem != NULL) {  /* successful allocation; slice memory */
                ptruint offset;
                unique->memused += (DD_MEM_CHUNK + 1) * sizeof(DdNode);
                mem[0] = (DdNodePtr) unique->memoryList;
                unique->memoryList = mem;

                /* Here we rely on the fact that a DdNode is as large as 4 pointers.  */
//                offset = (ptruint) mem & (sizeof(DdNode) - 1);
//                mem += (sizeof(DdNode) - offset) / sizeof(DdNodePtr);
//                assert(((ptruint) mem & (sizeof(DdNode) - 1)) == 0);
//                list = (DdNode *) mem;
                offset = (ptruint) mem & (32 - 1);
                mem += (32 - offset) / sizeof(DdNodePtr);
                assert(((ptruint) mem & (32 - 1)) == 0);
                list = (DdNode *) mem;

                i = 1;
                do {
                    list[i - 1].ref = 0;
                    list[i - 1].next = &list[i];
                } while (++i < DD_MEM_CHUNK);

                list[DD_MEM_CHUNK-1].ref = 0;
                list[DD_MEM_CHUNK-1].next = NULL;

                unique->nextFree = &list[0];
            }
        }
    }
    unique->allocated++;
    node = unique->nextFree;
    unique->nextFree = node->next;
    node->Id = (unique->allocated<<4);
    return(node);

}